

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void arima_setCSSML(arima_object obj,int cssml)

{
  if ((uint)cssml < 2) {
    obj->cssml = cssml;
    return;
  }
  puts("cssml only accepts two values 1 and 0 ");
  exit(-1);
}

Assistant:

void arima_setCSSML(arima_object obj, int cssml) {
	/*
	Uses CSS before MLE if cssml = 1.
	Only uses MLE if cssml = 0
	Only applicable with method 0
	*/

	if (cssml == 1) {
		obj->cssml = 1;
	} else if (cssml == 0) {
		obj->cssml = 0;
	} else {
		printf("cssml only accepts two values 1 and 0 \n");
		exit(-1);
	}

}